

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

EVaction add_proto_action(CManager_conflict cm,stone_type stone,proto_action **act)

{
  void *pvVar1;
  long *in_RDX;
  long in_RSI;
  int proto_action_num;
  size_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  iVar2 = *(int *)(in_RSI + 0x48);
  pvVar1 = INT_CMrealloc((void *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
                        );
  *(void **)(in_RSI + 0x50) = pvVar1;
  memset((void *)(*(long *)(in_RSI + 0x50) + (long)iVar2 * 0x60),0,0x60);
  *(int *)(in_RSI + 0x48) = *(int *)(in_RSI + 0x48) + 1;
  *in_RDX = *(long *)(in_RSI + 0x50) + (long)iVar2 * 0x60;
  return iVar2;
}

Assistant:

EVaction
add_proto_action(CManager cm, stone_type stone, proto_action **act)
{
    int proto_action_num = stone->proto_action_count;
    (void)cm;
    stone->proto_actions = realloc(stone->proto_actions, 
				   (proto_action_num + 1) * 
				   sizeof(stone->proto_actions[0]));
    memset(&stone->proto_actions[proto_action_num], 0, 
	   sizeof(stone->proto_actions[0]));
    ++stone->proto_action_count;
    *act = &stone->proto_actions[proto_action_num];
    return proto_action_num;
}